

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O2

string * __thiscall
Test::Formats::internal::utf32_to_string_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char32_t *ptr,size_t length)

{
  size_t i;
  char32_t *pcVar1;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (NATIVE_UTF8) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_68,(size_type)ptr);
    for (pcVar1 = (char32_t *)0x0; ptr != pcVar1; pcVar1 = (char32_t *)((long)pcVar1 + 1)) {
      appendAsUtf8(*(uint32_t *)(this + (long)pcVar1 * 4),&local_68);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
              (&local_68);
    std::operator+(&local_48,"\'",&local_68);
    std::operator+(__return_storage_ptr__,&local_48,"\'");
    std::__cxx11::string::~string(&local_48);
    std::__cxx11::string::~string(&local_68);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"(unknown encoding)",(allocator<char> *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::internal::utf32_to_string(const char32_t *ptr, std::size_t length) {
  if (NATIVE_UTF8) {
    // Convert UTF-32 to UTF-8
    std::string result{};
    result.reserve(length);

    for (std::size_t i = 0; i < length; ++i) {
      auto code = static_cast<uint32_t>(ptr[i]);
      appendAsUtf8(code, result);
    }

    result.shrink_to_fit();
    return "'" + result + "'";
  }
#ifdef _MSC_VER
  std::mbstate_t state{};
  std::string result;
  for (std::size_t i = 0; i < length; ++i) {
    std::array<char, MB_LEN_MAX> tmp{};
    std::size_t rc = std::c32rtomb(tmp.data(), ptr[i], &state);
    if (rc == static_cast<std::size_t>(-1)) {
      result.push_back('?');
      state = std::mbstate_t{};
      rc = 0;
    }
    for (std::size_t i = 0; i < rc; ++i) {
      result.push_back(tmp[i]);
    }
  }
  return "'" + result + "'";
#else
  return "(unknown encoding)";
#endif
}